

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cpp
# Opt level: O3

void Dio(double *x,int x_length,int fs,DioOption *option,double *temporal_positions,double *f0)

{
  size_t __n;
  double allowed_range;
  double dVar1;
  bool bVar2;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  fft_plan p_02;
  fft_plan p_03;
  fft_plan p_04;
  fft_plan p_05;
  double *yi;
  undefined8 uVar3;
  double *pdVar4;
  int i;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  double *pdVar12;
  ulong uVar13;
  fft_complex *out;
  double *pdVar14;
  ulong uVar15;
  fft_complex *padVar16;
  double **f0_candidates;
  long *plVar17;
  void *pvVar18;
  void *pvVar19;
  fft_complex *padVar20;
  double *pdVar21;
  double *interval_locations;
  double *interval_locations_00;
  double *intervals;
  double *intervals_00;
  double *intervals_01;
  double *intervals_02;
  void *pvVar22;
  void *pvVar23;
  void *pvVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  int i_4;
  size_t sVar32;
  ulong uVar33;
  undefined8 *puVar34;
  ulong uVar35;
  void *pvVar36;
  fft_plan *pfVar37;
  double *pdVar38;
  undefined8 *puVar39;
  void *pvVar40;
  ulong uVar41;
  int iVar42;
  uint uVar43;
  long lVar44;
  int i_3;
  uint number_of_candidates;
  int iVar45;
  byte bVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  undefined1 auVar59 [16];
  double dVar60;
  undefined1 auVar61 [16];
  double dVar62;
  int kMaximumNumber;
  fft_plan forwardFFT;
  fft_plan inverseFFT;
  undefined8 uStackY_288;
  undefined1 in_stack_fffffffffffffd80 [32];
  undefined1 in_stack_fffffffffffffda0 [40];
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 uVar63;
  undefined4 in_stack_fffffffffffffdd0;
  uint local_1e0;
  int local_1dc;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  undefined1 local_c8 [16];
  fft_complex *local_b8;
  double *local_b0;
  fft_complex *local_a8;
  fft_plan local_78;
  
  bVar46 = 0;
  dVar52 = option->frame_period;
  dVar58 = option->f0_floor;
  dVar51 = option->f0_ceil;
  dVar48 = option->channels_in_octave;
  iVar25 = option->speed;
  allowed_range = option->allowed_range;
  dVar47 = log(dVar51 / dVar58);
  iVar42 = (int)((dVar47 / 0.6931471805599453) * dVar48);
  number_of_candidates = iVar42 + 1;
  pdVar38 = (double *)((long)(int)number_of_candidates << 3);
  if (iVar42 < -1) {
    pdVar38 = (double *)0xffffffffffffffff;
  }
  pdVar12 = (double *)operator_new__((ulong)pdVar38);
  uVar41 = (ulong)number_of_candidates;
  if (-1 < iVar42) {
    uVar13 = 0;
    do {
      uVar31 = uVar13 + 1;
      dVar47 = exp2((double)(int)uVar31 / dVar48);
      pdVar12[uVar13] = dVar47 * dVar58;
      uVar13 = uVar31;
    } while (uVar41 != uVar31);
  }
  iVar45 = 0xc;
  if (iVar25 < 0xc) {
    iVar45 = iVar25;
  }
  iVar10 = 1;
  if (1 < iVar45) {
    iVar10 = iVar45;
  }
  uVar31 = (long)x_length / (long)iVar10 & 0xffffffff;
  dVar47 = (double)fs / (double)iVar10;
  dVar48 = dVar47 / 50.0;
  iVar5 = matlab_round(dVar48);
  iVar45 = (int)((long)x_length / (long)iVar10);
  uVar6 = GetSuitableFFTSize(iVar45 + iVar5 * 2 + (int)((dVar47 / *pdVar12) * 0.5 + 1.0) * 4 + 2);
  lVar44 = (long)(int)uVar6;
  uVar13 = lVar44 * 0x10;
  if ((int)uVar6 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  uVar35 = 0xffffffffffffffff;
  if ((int)uVar6 >= 0) {
    uVar35 = lVar44 * 8;
  }
  uVar11 = uVar6;
  out = (fft_complex *)operator_new__(uVar13);
  pdVar14 = (double *)operator_new__(uVar35);
  if (0 < (int)uVar6) {
    memset(pdVar14,0,lVar44 * 8);
  }
  uVar6 = iVar45 + 1;
  if (iVar25 < 2) {
    if (0 < x_length) {
      memcpy(pdVar14,x,(ulong)(uint)x_length << 3);
    }
  }
  else {
    decimate(x,x_length,iVar10,pdVar14);
  }
  uVar29 = (ulong)uVar6;
  if (-1 < iVar45) {
    dVar49 = 0.0;
    uVar15 = 0;
    do {
      dVar49 = dVar49 + pdVar14[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar29 != uVar15);
    uVar15 = 0;
    do {
      pdVar14[uVar15] = pdVar14[uVar15] - dVar49 / (double)(int)uVar6;
      uVar15 = uVar15 + 1;
    } while (uVar29 != uVar15);
  }
  if ((int)uVar6 < (int)uVar11) {
    memset(pdVar14 + (int)uVar6,0,(ulong)((uVar11 - iVar45) - 2) * 8 + 8);
  }
  fft_plan_dft_r2c_1d((fft_plan *)local_c8,uVar11,pdVar14,out,3);
  pfVar37 = (fft_plan *)local_c8;
  puVar34 = &uStackY_288;
  for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
    *puVar34 = *(undefined8 *)pfVar37;
    pfVar37 = (fft_plan *)((long)pfVar37 + (ulong)bVar46 * -0x10 + 8);
    puVar34 = puVar34 + (ulong)bVar46 * -2 + 1;
  }
  p_02.out._0_4_ = in_stack_fffffffffffffdc8;
  p_02.n = in_stack_fffffffffffffda0._0_4_;
  p_02.sign = in_stack_fffffffffffffda0._4_4_;
  p_02.flags = in_stack_fffffffffffffda0._8_4_;
  p_02._12_4_ = in_stack_fffffffffffffda0._12_4_;
  p_02.c_in = (fft_complex *)in_stack_fffffffffffffda0._16_8_;
  p_02.in = (double *)in_stack_fffffffffffffda0._24_8_;
  p_02.c_out = (fft_complex *)in_stack_fffffffffffffda0._32_8_;
  p_02.out._4_4_ = in_stack_fffffffffffffdcc;
  p_02.input._0_4_ = in_stack_fffffffffffffdd0;
  p_02.input._4_4_ = uVar11;
  p_02.ip = (int *)dVar48;
  p_02.w = pdVar38;
  fft_execute(p_02);
  uVar7 = matlab_round(dVar48);
  uVar9 = uVar7 * 2;
  uVar8 = uVar7 * 2 + 1;
  if (-1 < (int)uVar7) {
    dVar48 = (double)(int)(uVar9 + 2);
    uVar43 = 2;
    lVar26 = 0;
    do {
      dVar49 = cos(((double)uVar43 * 3.141592653589793) / dVar48);
      pdVar14[lVar26] = dVar49 * -0.5 + 0.5;
      lVar26 = lVar26 + 1;
      uVar43 = uVar43 + 2;
    } while ((ulong)uVar9 + 1 != lVar26);
  }
  if ((int)uVar8 < (int)uVar11) {
    memset(pdVar14 + (int)uVar8,0,(ulong)((uVar9 ^ 0xfffffffe) + uVar11) * 8 + 8);
  }
  if (-1 < (int)uVar7) {
    uVar15 = (ulong)uVar8;
    dVar49 = 0.0;
    uVar27 = 0;
    do {
      dVar49 = dVar49 + pdVar14[uVar27];
      uVar27 = uVar27 + 1;
    } while (uVar15 != uVar27);
    uVar27 = 0;
    do {
      pdVar14[uVar27] = -pdVar14[uVar27] / dVar49;
      uVar27 = uVar27 + 1;
    } while (uVar15 != uVar27);
    pdVar21 = pdVar14;
    if (uVar7 == 0) {
      uVar27 = 0;
    }
    else {
      uVar27 = (ulong)uVar7;
      uVar33 = 0;
      do {
        pdVar14[(long)(int)(uVar11 - uVar7) + uVar33] = pdVar14[uVar33];
        uVar33 = uVar33 + 1;
      } while (uVar27 != uVar33);
    }
    do {
      *pdVar21 = pdVar21[uVar27];
      uVar15 = uVar15 - 1;
      pdVar21 = pdVar21 + 1;
    } while (uVar15 != 0);
  }
  *pdVar14 = *pdVar14 + 1.0;
  padVar16 = (fft_complex *)operator_new__(uVar13);
  local_a8 = padVar16;
  puVar34 = (undefined8 *)local_c8;
  puVar39 = &uStackY_288;
  for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
    *puVar39 = *puVar34;
    puVar34 = puVar34 + (ulong)bVar46 * -2 + 1;
    puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
  }
  p_03.out._0_4_ = in_stack_fffffffffffffdc8;
  p_03.n = in_stack_fffffffffffffda0._0_4_;
  p_03.sign = in_stack_fffffffffffffda0._4_4_;
  p_03.flags = in_stack_fffffffffffffda0._8_4_;
  p_03._12_4_ = in_stack_fffffffffffffda0._12_4_;
  p_03.c_in = (fft_complex *)in_stack_fffffffffffffda0._16_8_;
  p_03.in = (double *)in_stack_fffffffffffffda0._24_8_;
  p_03.c_out = (fft_complex *)in_stack_fffffffffffffda0._32_8_;
  p_03.out._4_4_ = in_stack_fffffffffffffdcc;
  p_03.input._0_4_ = in_stack_fffffffffffffdd0;
  p_03.input._4_4_ = uVar11;
  p_03.ip = (int *)dVar48;
  p_03.w = pdVar38;
  fft_execute(p_03);
  if (-2 < (int)uVar11) {
    lVar26 = 0;
    do {
      dVar48 = *(double *)((long)*out + lVar26);
      dVar49 = *(double *)((long)*out + lVar26 + 8);
      pdVar21 = (double *)((long)*padVar16 + lVar26);
      dVar60 = *pdVar21;
      dVar1 = pdVar21[1];
      pdVar21 = (double *)((long)*out + lVar26);
      *pdVar21 = dVar48 * dVar60 + dVar1 * -dVar49;
      pdVar21[1] = dVar48 * dVar1 + dVar60 * dVar49;
      lVar26 = lVar26 + 0x10;
    } while ((ulong)(uint)((int)uVar11 / 2) * 0x10 + 0x10 != lVar26);
  }
  puVar34 = (undefined8 *)local_c8;
  puVar39 = &uStackY_288;
  for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
    *puVar39 = *puVar34;
    puVar34 = puVar34 + (ulong)bVar46 * -2 + 1;
    puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
  }
  p.c_out = (fft_complex *)in_stack_fffffffffffffda0._0_8_;
  p.out = (double *)in_stack_fffffffffffffda0._8_8_;
  p.input = (double *)in_stack_fffffffffffffda0._16_8_;
  p.ip = (int *)in_stack_fffffffffffffda0._24_8_;
  p.w = (double *)in_stack_fffffffffffffda0._32_8_;
  p.n = in_stack_fffffffffffffd80._0_4_;
  p.sign = in_stack_fffffffffffffd80._4_4_;
  p.flags = in_stack_fffffffffffffd80._8_4_;
  p._12_4_ = in_stack_fffffffffffffd80._12_4_;
  p.c_in = (fft_complex *)in_stack_fffffffffffffd80._16_8_;
  p.in = (double *)in_stack_fffffffffffffd80._24_8_;
  fft_destroy_plan(p);
  operator_delete__(pdVar14);
  operator_delete__(padVar16);
  f0_candidates = (double **)operator_new__((ulong)pdVar38);
  plVar17 = (long *)operator_new__((ulong)pdVar38);
  iVar25 = (int)((((double)x_length * 1000.0) / (double)fs) / dVar52);
  uVar63 = 0;
  uVar8 = iVar25 + 1;
  lVar26 = (long)(int)uVar8;
  if (-1 < iVar42) {
    uVar15 = 0xffffffffffffffff;
    if (-2 < iVar25) {
      uVar15 = lVar26 * 8;
    }
    uVar27 = 0;
    do {
      pdVar38 = (double *)operator_new__(uVar15);
      f0_candidates[uVar27] = pdVar38;
      pvVar18 = operator_new__(uVar15);
      plVar17[uVar27] = (long)pvVar18;
      uVar27 = uVar27 + 1;
    } while (uVar41 != uVar27);
  }
  auVar54 = _DAT_001101d0;
  uVar15 = (ulong)uVar8;
  if (-1 < iVar25) {
    lVar28 = uVar15 - 1;
    auVar53._8_4_ = (int)lVar28;
    auVar53._0_8_ = lVar28;
    auVar53._12_4_ = (int)((ulong)lVar28 >> 0x20);
    uVar27 = 0;
    auVar53 = auVar53 ^ _DAT_001101d0;
    auVar56 = _DAT_001101c0;
    do {
      bVar2 = auVar53._0_4_ < SUB164(auVar56 ^ auVar54,0);
      iVar10 = auVar53._4_4_;
      iVar5 = SUB164(auVar56 ^ auVar54,4);
      if ((bool)(~(iVar10 < iVar5 || iVar5 == iVar10 && bVar2) & 1)) {
        temporal_positions[uVar27] = ((double)(int)uVar27 * dVar52) / 1000.0;
      }
      if (iVar10 >= iVar5 && (iVar5 != iVar10 || !bVar2)) {
        temporal_positions[uVar27 + 1] = ((double)((int)uVar27 + 1) * dVar52) / 1000.0;
      }
      uVar27 = uVar27 + 2;
      lVar28 = auVar56._8_8_;
      auVar56._0_8_ = auVar56._0_8_ + 2;
      auVar56._8_8_ = lVar28 + 2;
    } while ((uVar15 + 1 & 0xfffffffffffffffe) != uVar27);
  }
  __n = uVar15 * 8;
  sVar32 = __n;
  if (iVar25 < -1) {
    sVar32 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(sVar32);
  pvVar19 = operator_new__(sVar32);
  if (-1 < iVar42) {
    uVar27 = uVar29 * 8;
    if (iVar45 < -1) {
      uVar27 = 0xffffffffffffffff;
    }
    lVar28 = uVar15 - 1;
    auVar54._8_4_ = (int)lVar28;
    auVar54._0_8_ = lVar28;
    auVar54._12_4_ = (int)((ulong)lVar28 >> 0x20);
    uVar9 = uVar11 & 0xfffffffe;
    uVar33 = 0;
    auVar54 = auVar54 ^ _DAT_001101d0;
    do {
      dVar48 = pdVar12[uVar33];
      pdVar38 = (double *)operator_new__(uVar35);
      iVar10 = matlab_round((dVar47 / dVar48) * 0.5);
      pdVar14 = (double *)operator_new__(uVar35);
      uVar7 = iVar10 * 4;
      NuttallWindow(uVar7,pdVar14);
      uVar43 = uVar11;
      if ((int)uVar7 < (int)uVar11) {
        memset(pdVar14 + (int)uVar7,0,(ulong)(~uVar7 + uVar11) * 8 + 8);
      }
      padVar16 = (fft_complex *)operator_new__(uVar13);
      fft_plan_dft_r2c_1d((fft_plan *)local_c8,uVar11,pdVar14,padVar16,3);
      pfVar37 = (fft_plan *)local_c8;
      puVar34 = &uStackY_288;
      for (lVar28 = 9; lVar28 != 0; lVar28 = lVar28 + -1) {
        *puVar34 = *(undefined8 *)pfVar37;
        pfVar37 = (fft_plan *)((long)pfVar37 + (ulong)bVar46 * -0x10 + 8);
        puVar34 = puVar34 + (ulong)bVar46 * -2 + 1;
      }
      p_04.out._0_4_ = iVar25;
      p_04.n = in_stack_fffffffffffffda0._0_4_;
      p_04.sign = in_stack_fffffffffffffda0._4_4_;
      p_04.flags = in_stack_fffffffffffffda0._8_4_;
      p_04._12_4_ = in_stack_fffffffffffffda0._12_4_;
      p_04.c_in = (fft_complex *)in_stack_fffffffffffffda0._16_8_;
      p_04.in = (double *)in_stack_fffffffffffffda0._24_8_;
      p_04.c_out = (fft_complex *)in_stack_fffffffffffffda0._32_8_;
      p_04.out._4_4_ = uVar63;
      p_04.input._0_4_ = in_stack_fffffffffffffdd0;
      p_04.input._4_4_ = uVar43;
      p_04.ip = (int *)f0_candidates;
      p_04.w = pdVar14;
      fft_execute(p_04);
      dVar49 = (*out)[0];
      dVar60 = (*out)[1];
      dVar1 = (*padVar16)[0];
      dVar62 = (*padVar16)[1];
      (*padVar16)[0] = dVar49 * dVar1 + dVar62 * -dVar60;
      (*padVar16)[1] = dVar49 * dVar62 + dVar1 * dVar60;
      if (1 < (int)uVar11) {
        padVar20 = padVar16 + lVar44 + -2;
        lVar28 = 0;
        do {
          dVar49 = *(double *)((long)out[1] + lVar28);
          dVar60 = *(double *)((long)out[1] + lVar28 + 8);
          pdVar21 = (double *)((long)padVar16[1] + lVar28);
          dVar1 = *pdVar21;
          dVar62 = pdVar21[1];
          dVar50 = dVar49 * dVar1 + dVar62 * -dVar60;
          dVar49 = dVar49 * dVar62 + dVar1 * dVar60;
          pdVar21 = (double *)((long)padVar16[1] + lVar28);
          *pdVar21 = dVar50;
          pdVar21[1] = dVar49;
          (*padVar20)[0] = dVar50;
          (*padVar20)[1] = dVar49;
          lVar28 = lVar28 + 0x10;
          padVar20 = padVar20 + -1;
        } while ((ulong)uVar9 << 3 != lVar28);
      }
      fft_plan_dft_c2r_1d(&local_78,uVar11,padVar16,pdVar38,3);
      pfVar37 = &local_78;
      puVar34 = &uStackY_288;
      uVar11 = uVar43;
      for (lVar28 = 9; lVar28 != 0; lVar28 = lVar28 + -1) {
        *puVar34 = *(undefined8 *)pfVar37;
        pfVar37 = (fft_plan *)((long)pfVar37 + (ulong)bVar46 * -0x10 + 8);
        puVar34 = puVar34 + (ulong)bVar46 * -2 + 1;
      }
      p_05.out._0_4_ = iVar25;
      p_05.n = in_stack_fffffffffffffda0._0_4_;
      p_05.sign = in_stack_fffffffffffffda0._4_4_;
      p_05.flags = in_stack_fffffffffffffda0._8_4_;
      p_05._12_4_ = in_stack_fffffffffffffda0._12_4_;
      p_05.c_in = (fft_complex *)in_stack_fffffffffffffda0._16_8_;
      p_05.in = (double *)in_stack_fffffffffffffda0._24_8_;
      p_05.c_out = (fft_complex *)in_stack_fffffffffffffda0._32_8_;
      p_05.out._4_4_ = uVar63;
      p_05.input._0_4_ = in_stack_fffffffffffffdd0;
      p_05.input._4_4_ = uVar11;
      p_05.ip = (int *)f0_candidates;
      p_05.w = pdVar14;
      fft_execute(p_05);
      if (-1 < iVar45) {
        pdVar21 = pdVar38;
        uVar30 = uVar29;
        do {
          *pdVar21 = pdVar21[iVar10 * 2];
          pdVar21 = pdVar21 + 1;
          uVar30 = uVar30 - 1;
        } while (uVar30 != 0);
      }
      pfVar37 = &local_78;
      puVar34 = &uStackY_288;
      for (lVar28 = 9; lVar28 != 0; lVar28 = lVar28 + -1) {
        *puVar34 = *(undefined8 *)pfVar37;
        pfVar37 = (fft_plan *)((long)pfVar37 + ((ulong)bVar46 * -2 + 1) * 8);
        puVar34 = puVar34 + (ulong)bVar46 * -2 + 1;
      }
      p_00.c_out = (fft_complex *)in_stack_fffffffffffffda0._0_8_;
      p_00.out = (double *)in_stack_fffffffffffffda0._8_8_;
      p_00.input = (double *)in_stack_fffffffffffffda0._16_8_;
      p_00.ip = (int *)in_stack_fffffffffffffda0._24_8_;
      p_00.w = (double *)in_stack_fffffffffffffda0._32_8_;
      p_00.n = in_stack_fffffffffffffd80._0_4_;
      p_00.sign = in_stack_fffffffffffffd80._4_4_;
      p_00.flags = in_stack_fffffffffffffd80._8_4_;
      p_00._12_4_ = in_stack_fffffffffffffd80._12_4_;
      p_00.c_in = (fft_complex *)in_stack_fffffffffffffd80._16_8_;
      p_00.in = (double *)in_stack_fffffffffffffd80._24_8_;
      fft_destroy_plan(p_00);
      puVar34 = (undefined8 *)local_c8;
      puVar39 = &uStackY_288;
      for (lVar28 = 9; lVar28 != 0; lVar28 = lVar28 + -1) {
        *puVar39 = *puVar34;
        puVar34 = puVar34 + (ulong)bVar46 * -2 + 1;
        puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
      }
      p_01.c_out = (fft_complex *)in_stack_fffffffffffffda0._0_8_;
      p_01.out = (double *)in_stack_fffffffffffffda0._8_8_;
      p_01.input = (double *)in_stack_fffffffffffffda0._16_8_;
      p_01.ip = (int *)in_stack_fffffffffffffda0._24_8_;
      p_01.w = (double *)in_stack_fffffffffffffda0._32_8_;
      p_01.n = in_stack_fffffffffffffd80._0_4_;
      p_01.sign = in_stack_fffffffffffffd80._4_4_;
      p_01.flags = in_stack_fffffffffffffd80._8_4_;
      p_01._12_4_ = in_stack_fffffffffffffd80._12_4_;
      p_01.c_in = (fft_complex *)in_stack_fffffffffffffd80._16_8_;
      p_01.in = (double *)in_stack_fffffffffffffd80._24_8_;
      fft_destroy_plan(p_01);
      operator_delete__(padVar16);
      operator_delete__(pdVar14);
      pdVar14 = (double *)operator_new__(uVar27);
      pdVar21 = (double *)operator_new__(uVar27);
      interval_locations = (double *)operator_new__(uVar27);
      interval_locations_00 = (double *)operator_new__(uVar27);
      intervals = (double *)operator_new__(uVar27);
      intervals_00 = (double *)operator_new__(uVar27);
      intervals_01 = (double *)operator_new__(uVar27);
      intervals_02 = (double *)operator_new__(uVar27);
      uVar7 = anon_unknown.dwarf_a055::ZeroCrossingEngine(pdVar38,uVar6,dVar47,pdVar14,intervals);
      if (iVar45 < 0) {
        local_1dc = anon_unknown.dwarf_a055::ZeroCrossingEngine
                              (pdVar38,uVar6,dVar47,pdVar21,intervals_00);
LAB_00106f98:
        local_1e0 = anon_unknown.dwarf_a055::ZeroCrossingEngine
                              (pdVar38,iVar45,dVar47,interval_locations,intervals_01);
      }
      else {
        uVar30 = 0;
        do {
          pdVar38[uVar30] = -pdVar38[uVar30];
          uVar30 = uVar30 + 1;
        } while (uVar29 != uVar30);
        local_1dc = anon_unknown.dwarf_a055::ZeroCrossingEngine
                              (pdVar38,uVar6,dVar47,pdVar21,intervals_00);
        if (iVar45 == 0) goto LAB_00106f98;
        uVar30 = 0;
        dVar49 = *pdVar38;
        do {
          lVar28 = uVar30 + 1;
          pdVar38[uVar30] = dVar49 - pdVar38[lVar28];
          uVar30 = uVar30 + 1;
          dVar49 = pdVar38[lVar28];
        } while (uVar31 != uVar30);
        local_1e0 = anon_unknown.dwarf_a055::ZeroCrossingEngine
                              (pdVar38,iVar45,dVar47,interval_locations,intervals_01);
        uVar30 = 0;
        do {
          pdVar38[uVar30] = -pdVar38[uVar30];
          uVar30 = uVar30 + 1;
        } while (uVar31 != uVar30);
      }
      uVar43 = anon_unknown.dwarf_a055::ZeroCrossingEngine
                         (pdVar38,iVar45,dVar47,interval_locations_00,intervals_02);
      if ((((uVar7 < 3) || (local_1dc < 3)) || (local_1e0 < 3)) || (uVar43 < 3)) {
        if (-1 < iVar25) {
          memset(pvVar18,0,__n);
          uVar30 = 0;
          auVar55 = _DAT_001101c0;
          do {
            auVar56 = auVar55 ^ _DAT_001101d0;
            local_1a8 = auVar54._0_4_;
            iStack_1a4 = auVar54._4_4_;
            iStack_1a0 = auVar54._8_4_;
            iStack_19c = auVar54._12_4_;
            auVar59._0_4_ = -(uint)(local_1a8 < auVar56._0_4_);
            auVar59._4_4_ = -(uint)(iStack_1a4 < auVar56._4_4_);
            auVar59._8_4_ = -(uint)(iStack_1a0 < auVar56._8_4_);
            auVar59._12_4_ = -(uint)(iStack_19c < auVar56._12_4_);
            iVar10 = -(uint)(auVar56._4_4_ == iStack_1a4);
            iVar5 = -(uint)(auVar56._12_4_ == iStack_19c);
            auVar61._4_4_ = iVar10;
            auVar61._0_4_ = iVar10;
            auVar61._8_4_ = iVar5;
            auVar61._12_4_ = iVar5;
            auVar57._4_4_ = auVar59._4_4_;
            auVar57._0_4_ = auVar59._4_4_;
            auVar57._8_4_ = auVar59._12_4_;
            auVar57._12_4_ = auVar59._12_4_;
            auVar57 = auVar57 | auVar61 & auVar59;
            if ((~auVar57._0_4_ & 1) != 0) {
              *(undefined8 *)((long)pvVar19 + uVar30) = 0x40f86a0000000000;
            }
            if (((auVar57 ^ _DAT_00110310) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined8 *)((long)pvVar19 + uVar30 + 8) = 0x40f86a0000000000;
            }
            lVar28 = auVar55._8_8_;
            auVar55._0_8_ = auVar55._0_8_ + 2;
            auVar55._8_8_ = lVar28 + 2;
            uVar30 = uVar30 + 0x10;
          } while ((uVar15 * 8 + 8 & 0xfffffffffffffff0) != uVar30);
          goto LAB_001072f3;
        }
        operator_delete__(pdVar14);
        operator_delete__(pdVar21);
        operator_delete__(interval_locations);
        operator_delete__(interval_locations_00);
        operator_delete__(intervals);
        operator_delete__(intervals_00);
        operator_delete__(intervals_01);
        operator_delete__(intervals_02);
        operator_delete__(pdVar38);
      }
      else {
        lVar28 = 0;
        do {
          pvVar22 = operator_new__(sVar32);
          *(void **)(local_c8 + lVar28 * 8) = pvVar22;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 4);
        yi = (double *)CONCAT44(local_c8._4_4_,local_c8._0_4_);
        interp1(pdVar14,intervals,uVar7,temporal_positions,uVar8,yi);
        uVar3 = local_c8._8_8_;
        interp1(pdVar21,intervals_00,local_1dc,temporal_positions,uVar8,(double *)local_c8._8_8_);
        padVar16 = local_b8;
        interp1(interval_locations,intervals_01,local_1e0,temporal_positions,uVar8,*local_b8);
        pdVar4 = local_b0;
        interp1(interval_locations_00,intervals_02,uVar43,temporal_positions,uVar8,local_b0);
        if (-1 < iVar25) {
          uVar30 = 0;
          do {
            dVar49 = yi[uVar30];
            dVar60 = *(double *)(uVar3 + uVar30 * 8);
            dVar1 = (*padVar16)[uVar30];
            dVar62 = pdVar4[uVar30];
            dVar50 = (dVar49 + dVar60 + dVar1 + dVar62) * 0.25;
            *(double *)((long)pvVar18 + uVar30 * 8) = dVar50;
            dVar49 = dVar49 - dVar50;
            dVar60 = dVar60 - dVar50;
            dVar1 = dVar1 - dVar50;
            dVar62 = dVar62 - dVar50;
            *(double *)((long)pvVar19 + uVar30 * 8) =
                 SQRT((dVar62 * dVar62 + dVar1 * dVar1 + dVar49 * dVar49 + dVar60 * dVar60) / 3.0);
            if (((dVar50 < dVar58) || (dVar51 < dVar50)) ||
               ((dVar48 < dVar50 || (dVar50 < dVar48 * 0.5)))) {
              *(undefined8 *)((long)pvVar18 + uVar30 * 8) = 0;
              *(undefined8 *)((long)pvVar19 + uVar30 * 8) = 0x40f86a0000000000;
            }
            uVar30 = uVar30 + 1;
          } while (uVar15 != uVar30);
        }
        lVar28 = 0;
        do {
          if (*(void **)(local_c8 + lVar28 * 8) != (void *)0x0) {
            operator_delete__(*(void **)(local_c8 + lVar28 * 8));
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 4);
LAB_001072f3:
        operator_delete__(pdVar14);
        operator_delete__(pdVar21);
        operator_delete__(interval_locations);
        operator_delete__(interval_locations_00);
        operator_delete__(intervals);
        operator_delete__(intervals_00);
        operator_delete__(intervals_01);
        operator_delete__(intervals_02);
        operator_delete__(pdVar38);
        if (-1 < iVar25) {
          lVar28 = plVar17[uVar33];
          pdVar38 = f0_candidates[uVar33];
          uVar30 = 0;
          do {
            dVar48 = *(double *)((long)pvVar18 + uVar30 * 8);
            *(double *)(lVar28 + uVar30 * 8) =
                 *(double *)((long)pvVar19 + uVar30 * 8) / (dVar48 + 1e-12);
            pdVar38[uVar30] = dVar48;
            uVar30 = uVar30 + 1;
          } while (uVar15 != uVar30);
        }
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar41);
  }
  operator_delete__(pvVar18);
  operator_delete__(pvVar19);
  uVar13 = lVar26 * 8;
  if (iVar25 < -1) {
    uVar13 = 0xffffffffffffffff;
  }
  iVar45 = iVar25;
  pvVar18 = operator_new__(uVar13);
  if (-1 < iVar25) {
    lVar44 = *plVar17;
    pdVar38 = *f0_candidates;
    uVar31 = 0;
    do {
      dVar51 = *(double *)(lVar44 + uVar31 * 8);
      *(double *)((long)pvVar18 + uVar31 * 8) = pdVar38[uVar31];
      if (0 < iVar42) {
        uVar35 = 1;
        do {
          dVar48 = *(double *)(plVar17[uVar35] + uVar31 * 8);
          if (dVar48 < dVar51) {
            *(double *)((long)pvVar18 + uVar31 * 8) = f0_candidates[uVar35][uVar31];
            dVar51 = dVar48;
          }
          uVar35 = uVar35 + 1;
        } while (uVar41 != uVar35);
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 != uVar15);
  }
  iVar25 = (int)((1000.0 / dVar52) / dVar58 + 0.5);
  if (iVar25 * 2 < iVar45) {
    uVar6 = iVar25 * 2 + 1;
    pvVar19 = operator_new__(uVar13);
    pvVar22 = operator_new__(uVar13);
    pvVar23 = operator_new__(sVar32);
    if (-1 < iVar25) {
      memset(pvVar23,0,(ulong)uVar6 * 8);
    }
    if ((int)uVar6 < (int)(uVar8 - uVar6)) {
      memcpy((void *)((long)pvVar23 + (long)(int)uVar6 * 8),
             (void *)((long)pvVar18 + (long)(int)uVar6 * 8),(ulong)(iVar45 + uVar6 * -2) * 8 + 8);
    }
    if (-1 < iVar25) {
      uVar11 = (iVar45 - uVar6) + 2;
      if ((int)uVar11 < (int)uVar8) {
        uVar11 = uVar8;
      }
      memset((void *)((long)pvVar23 + (long)(int)(uVar8 - uVar6) * 8),0,
             (ulong)((uVar11 + (uVar6 - iVar45)) - 2) * 8 + 8);
      memset(pvVar19,0,(ulong)uVar6 << 3);
    }
    lVar44 = (long)(int)uVar6;
    do {
      dVar52 = *(double *)((long)pvVar23 + lVar44 * 8);
      *(ulong *)((long)pvVar19 + lVar44 * 8) =
           -(ulong)(ABS((dVar52 - *(double *)((long)pvVar23 + lVar44 * 8 + -8)) / (dVar52 + 1e-12))
                   < allowed_range) & (ulong)dVar52;
      lVar44 = lVar44 + 1;
    } while (lVar26 != lVar44);
    operator_delete__(pvVar23);
    pvVar23 = pvVar22;
    if (-1 < iVar45) {
      memcpy(pvVar22,pvVar19,__n);
    }
    if (iVar25 < (int)(uVar8 - iVar25)) {
      iVar10 = -iVar25;
      lVar44 = (long)iVar25;
      if (iVar25 != iVar10 && SBORROW4(iVar25,iVar10) == iVar25 * 2 < 0) {
        iVar10 = iVar25;
      }
      pvVar36 = pvVar19;
      do {
        if (-1 < iVar25) {
          lVar28 = 0;
          do {
            dVar52 = *(double *)((long)pvVar36 + lVar28 * 8);
            if ((dVar52 == 0.0) && (!NAN(dVar52))) {
              *(undefined8 *)((long)pvVar22 + lVar44 * 8) = 0;
              break;
            }
            lVar28 = lVar28 + 1;
          } while (iVar10 + iVar25 + 1 != (int)lVar28);
        }
        lVar44 = lVar44 + 1;
        pvVar36 = (void *)((long)pvVar36 + 8);
      } while (lVar44 != (int)(uVar8 - iVar25));
    }
    uVar13 = 0xffffffffffffffff;
    if (-2 < iVar45) {
      uVar13 = lVar26 << 2;
    }
    iVar25 = iVar45;
    pvVar36 = operator_new__(uVar13);
    pvVar22 = pvVar23;
    pvVar24 = operator_new__(uVar13);
    local_78.n = 0;
    local_c8._0_4_ = 0;
    if (0 < iVar45) {
      uVar13 = 1;
      do {
        dVar52 = *(double *)((long)pvVar23 + uVar13 * 8);
        iVar45 = (int)uVar13;
        if ((dVar52 != 0.0) || (NAN(dVar52))) {
          dVar58 = *(double *)((long)pvVar23 + uVar13 * 8 + -8);
LAB_00107794:
          if (((dVar52 != 0.0) || (NAN(dVar52))) &&
             ((dVar58 == 0.0 && (pfVar37 = (fft_plan *)local_c8, pvVar40 = pvVar36, !NAN(dVar58)))))
          goto LAB_001077ad;
        }
        else {
          dVar58 = *(double *)((long)pvVar23 + uVar13 * 8 + -8);
          if ((dVar58 == 0.0) && (!NAN(dVar58))) goto LAB_00107794;
          iVar45 = iVar45 + -1;
          pfVar37 = &local_78;
          pvVar40 = pvVar24;
LAB_001077ad:
          iVar10 = pfVar37->n;
          pfVar37->n = iVar10 + 1;
          *(int *)((long)pvVar40 + (long)iVar10 * 4) = iVar45;
        }
        uVar13 = uVar13 + 1;
      } while (uVar15 != uVar13);
    }
    iVar45 = local_78.n;
    if (-1 < iVar25) {
      memcpy(pvVar19,pvVar23,__n);
    }
    if (0 < iVar45) {
      uVar13 = 0;
      do {
        iVar10 = iVar25;
        if (uVar13 != iVar45 - 1) {
          iVar10 = *(int *)((long)pvVar24 + uVar13 * 4 + 4);
        }
        iVar5 = *(int *)((long)pvVar24 + uVar13 * 4);
        lVar44 = (long)iVar5;
        if (iVar10 <= iVar5) {
          iVar10 = iVar5;
        }
        lVar26 = 0;
        do {
          if (iVar10 - lVar44 == lVar26) break;
          dVar52 = anon_unknown.dwarf_a055::SelectBestF0
                             (*(double *)((long)pvVar19 + lVar26 * 8 + lVar44 * 8),
                              *(double *)((long)pvVar19 + lVar26 * 8 + lVar44 * 8 + -8),
                              f0_candidates,number_of_candidates,iVar5 + 1 + (int)lVar26,
                              allowed_range);
          *(double *)((long)pvVar19 + lVar26 * 8 + lVar44 * 8 + 8) = dVar52;
          lVar26 = lVar26 + 1;
        } while ((dVar52 != 0.0) || (NAN(dVar52)));
        uVar13 = uVar13 + 1;
      } while (uVar13 != (uint)iVar45);
    }
    uVar63 = local_c8._0_4_;
    uVar13 = (ulong)(uint)local_c8._0_4_;
    if (-1 < iVar25) {
      memcpy(f0,pvVar19,__n);
    }
    if (0 < (int)uVar63) {
      do {
        uVar31 = uVar13 - 1;
        if (uVar31 == 0) {
          lVar44 = 1;
        }
        else {
          lVar44 = (long)*(int *)((long)pvVar36 + uVar13 * 4 + -8);
        }
        iVar25 = *(int *)((long)pvVar36 + uVar31 * 4);
        iVar45 = iVar25 + -1;
        lVar26 = (long)iVar25;
        do {
          if (lVar26 <= lVar44) break;
          lVar28 = lVar26 + -1;
          dVar52 = anon_unknown.dwarf_a055::SelectBestF0
                             (f0[lVar26],f0[lVar26 + 1],f0_candidates,number_of_candidates,iVar45,
                              allowed_range);
          f0[lVar26 + -1] = dVar52;
          iVar45 = iVar45 + -1;
          lVar26 = lVar28;
        } while ((dVar52 != 0.0) || (NAN(dVar52)));
        bVar2 = 1 < (long)uVar13;
        uVar13 = uVar31;
      } while (bVar2);
    }
    operator_delete__(pvVar19);
    operator_delete__(pvVar22);
    operator_delete__(pvVar36);
    operator_delete__(pvVar24);
  }
  operator_delete__(pvVar18);
  operator_delete__(out);
  if (-1 < iVar42) {
    uVar13 = 0;
    do {
      if ((void *)plVar17[uVar13] != (void *)0x0) {
        operator_delete__((void *)plVar17[uVar13]);
      }
      if (f0_candidates[uVar13] != (double *)0x0) {
        operator_delete__(f0_candidates[uVar13]);
      }
      uVar13 = uVar13 + 1;
    } while (uVar41 != uVar13);
  }
  operator_delete__(plVar17);
  operator_delete__(f0_candidates);
  operator_delete__(pdVar12);
  return;
}

Assistant:

void Dio(const double *x, int x_length, int fs, const DioOption *option,
    double *temporal_positions, double *f0) {
  DioGeneralBody(x, x_length, fs, option->frame_period, option->f0_floor,
      option->f0_ceil, option->channels_in_octave, option->speed,
      option->allowed_range, temporal_positions, f0);
}